

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

int dump_siblings(lyout *out,lyxml_elem *e,int options)

{
  lyxml_elem *plVar1;
  int iVar2;
  lyxml_elem *e_00;
  int iVar3;
  
  if (e->parent == (lyxml_elem *)0x0) {
    do {
      e_00 = e;
      e = e_00->prev;
      if (e == (lyxml_elem *)0x0) break;
    } while (e->next != (lyxml_elem *)0x0);
  }
  else {
    e_00 = e->parent->child;
  }
  iVar3 = 0;
  while (e_00 != (lyxml_elem *)0x0) {
    plVar1 = e_00->next;
    iVar2 = dump_elem(out,e_00,0,options,(uint)(plVar1 == (lyxml_elem *)0x0));
    iVar3 = iVar3 + iVar2;
    e_00 = plVar1;
  }
  return iVar3;
}

Assistant:

static int
dump_siblings(struct lyout *out, const struct lyxml_elem *e, int options)
{
    const struct lyxml_elem *start, *iter, *next;
    int ret = 0;

    if (e->parent) {
        start = e->parent->child;
    } else {
        start = e;
        while(start->prev && start->prev->next) {
            start = start->prev;
        }
    }

    LY_TREE_FOR_SAFE(start, next, iter) {
        ret += dump_elem(out, iter, 0, options, (next ? 0 : 1));
    }

    return ret;
}